

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * doctest::toString(String *__return_storage_ptr__,float in)

{
  String local_48;
  String local_30;
  float local_14;
  String *pSStack_10;
  float in_local;
  
  local_14 = in;
  pSStack_10 = __return_storage_ptr__;
  anon_unknown_14::fpToString<float>(&local_30,in,5);
  String::String(&local_48,"f");
  String::operator+(__return_storage_ptr__,&local_30,&local_48);
  String::~String(&local_48);
  String::~String(&local_30);
  return __return_storage_ptr__;
}

Assistant:

String toString(float in) { return fpToString(in, 5) + "f"; }